

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink7.c
# Opt level: O1

Vec_Int_t * Unm_ManComputePairs(Unm_Man_t *p,int fVerbose)

{
  int iData1;
  uint uVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Vec_Int_t *__ptr;
  Hash_IntMan_t *p_01;
  Vec_Int_t *__ptr_00;
  Vec_Int_t *__ptr_01;
  Gia_Man_t *pGVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  uint uVar8;
  uint uVar9;
  int Entry;
  long lVar10;
  long in_R8;
  int iVar11;
  int iData0;
  int nPairs0;
  long lVar12;
  long local_50;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(4000);
  p_00->pArray = piVar2;
  __ptr = (Vec_Int_t *)malloc(0x10);
  __ptr->nCap = 0x10;
  __ptr->nSize = 0;
  piVar2 = (int *)malloc(0x40);
  __ptr->pArray = piVar2;
  __ptr->nSize = 1;
  *piVar2 = 0;
  p_01 = (Hash_IntMan_t *)calloc(1,0x18);
  uVar9 = 1099;
  while( true ) {
    do {
      uVar8 = uVar9;
      uVar9 = uVar8 + 1;
    } while ((uVar8 & 1) != 0);
    if (uVar9 < 9) break;
    iVar5 = 5;
    while (uVar9 % (iVar5 - 2U) != 0) {
      uVar1 = iVar5 * iVar5;
      iVar5 = iVar5 + 2;
      if (uVar9 < uVar1) goto LAB_00715a75;
    }
  }
LAB_00715a75:
  __ptr_00 = (Vec_Int_t *)malloc(0x10);
  uVar1 = 0x10;
  if (0xe < uVar8) {
    uVar1 = uVar9;
  }
  __ptr_00->nSize = 0;
  __ptr_00->nCap = uVar1;
  piVar2 = (int *)malloc((long)(int)uVar1 << 2);
  __ptr_00->pArray = piVar2;
  __ptr_00->nSize = uVar9;
  nPairs0 = 0;
  memset(piVar2,0,(long)(int)uVar9 << 2);
  p_01->vTable = __ptr_00;
  __ptr_01 = (Vec_Int_t *)malloc(0x10);
  __ptr_01->nCap = 0x1130;
  __ptr_01->nSize = 0;
  piVar2 = (int *)malloc(0x44c0);
  __ptr_01->pArray = piVar2;
  p_01->vObjs = __ptr_01;
  piVar2[0] = 0;
  piVar2[1] = 0;
  piVar2[2] = 0;
  piVar2[3] = 0;
  __ptr_01->nSize = 4;
  p_01->nRefs = 1;
  Gia_ManSetRefsMapped(p->pGia);
  pGVar3 = p->pGia;
  iVar5 = 0;
  if (1 < pGVar3->nObjs) {
    iVar5 = 0;
    in_R8 = 1;
    nPairs0 = 0;
    do {
      iVar11 = pGVar3->vMapping->nSize;
      if (iVar11 <= in_R8) goto LAB_00715e7b;
      piVar2 = pGVar3->vMapping->pArray;
      uVar9 = piVar2[in_R8];
      if ((ulong)uVar9 != 0) {
        if (((int)uVar9 < 0) || (iVar11 <= (int)uVar9)) {
LAB_00715e7b:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar11 = piVar2[uVar9];
        p->vLeaves->nSize = 0;
        pGVar3 = p->pGia;
        pVVar4 = pGVar3->vMapping;
        lVar6 = (long)pVVar4->nSize;
        if (lVar6 <= in_R8) goto LAB_00715e7b;
        iVar5 = iVar5 + ((iVar11 + -1) * iVar11) / 2;
        lVar12 = 0;
        while( true ) {
          piVar2 = pVVar4->pArray;
          lVar10 = (long)piVar2[in_R8];
          if ((lVar10 < 0) || ((int)lVar6 <= piVar2[in_R8])) goto LAB_00715e7b;
          if (piVar2[lVar10] <= lVar12) break;
          if (1 < pGVar3->pRefs[piVar2[lVar10 + lVar12 + 1]]) {
            Vec_IntPush(p->vLeaves,piVar2[lVar10 + lVar12 + 1]);
          }
          lVar12 = lVar12 + 1;
          pGVar3 = p->pGia;
          pVVar4 = pGVar3->vMapping;
          lVar6 = (long)pVVar4->nSize;
          if (lVar6 <= in_R8) goto LAB_00715e7b;
        }
        iVar11 = p->vLeaves->nSize;
        if (1 < iVar11) {
          nPairs0 = nPairs0 + ((iVar11 + -1) * iVar11) / 2;
          pVVar4 = p->vLeaves;
          if (0 < pVVar4->nSize) {
            local_50 = 1;
            lVar6 = 0;
            do {
              lVar12 = lVar6 + 1;
              pVVar7 = p->vLeaves;
              if (lVar12 < pVVar7->nSize) {
                lVar10 = local_50;
                iVar11 = pVVar4->pArray[lVar6];
                do {
                  iData1 = pVVar7->pArray[lVar10];
                  iData0 = iData1;
                  if (iVar11 < iData1) {
                    iData0 = iVar11;
                  }
                  if (iData1 < iVar11) {
                    iData1 = iVar11;
                  }
                  uVar9 = Hash_Int2ManInsert(p_01,iData0,iData1,(int)pVVar7->pArray);
                  if ((int)uVar9 < 0) {
LAB_00715e5c:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                  ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
                  }
                  uVar8 = uVar9 * 4;
                  uVar1 = __ptr_01->nSize;
                  if (uVar1 == uVar8 || SBORROW4(uVar1,uVar8) != (int)(uVar1 + uVar9 * -4) < 0)
                  goto LAB_00715e5c;
                  iVar11 = __ptr_01->pArray[(ulong)uVar8 + 2];
                  __ptr_01->pArray[(ulong)uVar8 + 2] = iVar11 + 1;
                  Entry = (int)in_R8;
                  if (iVar11 == 1) {
                    if (__ptr->nSize <= (int)uVar9) {
                      __assert_fail("Num < Vec_IntSize(vNum2Obj)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink7.c"
                                    ,0xbf,"Vec_Int_t *Unm_ManComputePairs(Unm_Man_t *, int)");
                    }
                    Vec_IntPush(p_00,__ptr->pArray[uVar9]);
                    Vec_IntPush(p_00,iData0);
                    Vec_IntPush(p_00,iData1);
LAB_00715d34:
                    Vec_IntPush(p_00,Entry);
                    Vec_IntPush(p_00,iData0);
                    pVVar4 = p_00;
                    Entry = iData1;
                  }
                  else {
                    if (iVar11 != 0) goto LAB_00715d34;
                    uVar8 = uVar1 + 3;
                    if (-1 < (int)uVar1) {
                      uVar8 = uVar1;
                    }
                    if (uVar9 != ((int)uVar8 >> 2) - 1U) {
                      __assert_fail("Num == Hash_IntManEntryNum(pHash)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink7.c"
                                    ,0xb8,"Vec_Int_t *Unm_ManComputePairs(Unm_Man_t *, int)");
                    }
                    pVVar4 = __ptr;
                    if (uVar9 != __ptr->nSize) {
                      __assert_fail("Num == Vec_IntSize(vNum2Obj)",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaShrink7.c"
                                    ,0xb9,"Vec_Int_t *Unm_ManComputePairs(Unm_Man_t *, int)");
                    }
                  }
                  Vec_IntPush(pVVar4,Entry);
                  lVar10 = lVar10 + 1;
                  pVVar7 = p->vLeaves;
                  iVar11 = iData0;
                } while ((int)lVar10 < pVVar7->nSize);
              }
              pVVar4 = p->vLeaves;
              local_50 = local_50 + 1;
              lVar6 = lVar12;
            } while (lVar12 < pVVar4->nSize);
          }
        }
      }
      in_R8 = in_R8 + 1;
      pGVar3 = p->pGia;
    } while (in_R8 < pGVar3->nObjs);
  }
  iVar11 = (int)in_R8;
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (int *)0x0;
  }
  free(__ptr);
  if (fVerbose != 0) {
    Unm_ManPrintPairStats(p_01,iVar5,nPairs0,p_00->nSize / 3,iVar11);
  }
  if (__ptr_01->pArray != (int *)0x0) {
    free(__ptr_01->pArray);
    __ptr_01->pArray = (int *)0x0;
  }
  free(__ptr_01);
  if (__ptr_00->pArray != (int *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (int *)0x0;
  }
  free(__ptr_00);
  free(p_01);
  return p_00;
}

Assistant:

Vec_Int_t * Unm_ManComputePairs( Unm_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vPairs = Vec_IntAlloc( 1000 );
    Vec_Int_t * vNum2Obj = Vec_IntStart( 1 );
    Hash_IntMan_t * pHash = Hash_IntManStart( 1000 );
    int nTotal = 0, nPairs0 = 0, nPairs = 0;
    int i, k, j, FanK, FanJ, Num, nRefs;
    Gia_ManSetRefsMapped( p->pGia );
    Gia_ManForEachLut( p->pGia, i )
    {
        nTotal += Gia_ObjLutSize(p->pGia, i) * (Gia_ObjLutSize(p->pGia, i) - 1) / 2;
        pObj = Gia_ManObj( p->pGia, i );
        // collect leaves of this gate  
        Vec_IntClear( p->vLeaves );
        Gia_LutForEachFanin( p->pGia, i, Num, k )
            if ( Gia_ObjRefNumId(p->pGia, Num) > 1 )
                Vec_IntPush( p->vLeaves, Num );
        if ( Vec_IntSize(p->vLeaves) < 2 )
            continue;
        nPairs0 += Vec_IntSize(p->vLeaves) * (Vec_IntSize(p->vLeaves) - 1) / 2;
        // enumerate pairs
        Vec_IntForEachEntry( p->vLeaves, FanK, k )
        Vec_IntForEachEntryStart( p->vLeaves, FanJ, j, k+1 )
        {
            if ( FanK > FanJ )
                ABC_SWAP( int, FanK, FanJ );
            Num = Hash_Int2ManInsert( pHash, FanK, FanJ, 0 );
            nRefs = Hash_Int2ObjInc(pHash, Num);
            if ( nRefs == 0 )
            {
                assert( Num == Hash_IntManEntryNum(pHash) );
                assert( Num == Vec_IntSize(vNum2Obj) );
                Vec_IntPush( vNum2Obj, i );
                continue;
            }
            if ( nRefs == 1 )
            {
                assert( Num < Vec_IntSize(vNum2Obj) );
                Vec_IntPush( vPairs, Vec_IntEntry(vNum2Obj, Num) );
                Vec_IntPush( vPairs, FanK );
                Vec_IntPush( vPairs, FanJ);
            }
            Vec_IntPush( vPairs, i );
            Vec_IntPush( vPairs, FanK );
            Vec_IntPush( vPairs, FanJ );
        }
    }
    Vec_IntFree( vNum2Obj );
    if ( fVerbose )
        nPairs = Unm_ManPrintPairStats( pHash, nTotal, nPairs0, Vec_IntSize(vPairs) / 3, 0 );
    Hash_IntManStop( pHash );
    return vPairs;    
}